

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_user.cpp
# Opt level: O1

void P_CalcHeight(player_t *player)

{
  float fVar1;
  double dVar2;
  APlayerPawn *pAVar3;
  bool bVar4;
  undefined8 *puVar5;
  undefined8 *puVar6;
  double dVar7;
  double dVar8;
  
  if (((uint)player->cheats >> 0x1e & 1) == 0) {
    if ((((player->mo->super_AActor).flags.Value & 0x200) != 0) && (player->onground == false)) {
      dVar7 = 0.5;
LAB_0046a632:
      player->bob = dVar7;
      goto LAB_0046a636;
    }
    dVar7 = (player->Vel).X;
    dVar2 = (player->Vel).Y;
    dVar7 = dVar2 * dVar2 + dVar7 * dVar7;
    player->bob = dVar7;
    bVar4 = true;
    if ((dVar7 != 0.0) || (NAN(dVar7))) {
      puVar5 = (undefined8 *)
               ((long)&((player->userinfo).
                        super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>
                       .Nodes)->Next +
               (ulong)(((player->userinfo).
                        super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>
                        .Size - 1 & 0x239) * 0x18));
      do {
        puVar6 = puVar5;
        puVar5 = (undefined8 *)*puVar6;
      } while (*(int *)(puVar6 + 1) != 0x239);
      dVar7 = dVar7 * (double)*(float *)(puVar6[2] + 0x28);
      player->bob = dVar7;
      if (dVar7 <= 16.0) goto LAB_0046a636;
      dVar7 = 16.0;
      goto LAB_0046a632;
    }
  }
  else {
    player->bob = 0.0;
LAB_0046a636:
    bVar4 = false;
  }
  pAVar3 = player->mo;
  dVar7 = pAVar3->ViewHeight + player->crouchviewdelta;
  if ((player->cheats & 4U) != 0) {
    dVar7 = dVar7 + (pAVar3->super_AActor).__Pos.Z;
    player->viewz = dVar7;
    dVar2 = (pAVar3->super_AActor).ceilingz + -4.0;
    if (dVar7 <= dVar2) {
      return;
    }
    goto LAB_0046a838;
  }
  if (bVar4) {
    if (player->health < 1) {
      dVar2 = 0.0;
    }
    else {
      puVar5 = (undefined8 *)
               ((long)&((player->userinfo).
                        super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>
                       .Nodes)->Next +
               (ulong)(((player->userinfo).
                        super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>
                        .Size - 1 & 0x23a) * 0x18));
      do {
        puVar6 = puVar5;
        puVar5 = (undefined8 *)*puVar6;
      } while (*(int *)(puVar6 + 1) != 0x23a);
      fVar1 = *(float *)(puVar6[2] + 0x28);
      dVar2 = FFastTrig::sin(&fasttrig,
                             ((double)level.time / 120.0) * 360.0 * 11930464.711111112 +
                             6755399441055744.0);
      dVar2 = dVar2 * (double)fVar1;
    }
  }
  else {
    dVar2 = player->bob;
    dVar8 = FFastTrig::sin(&fasttrig,
                           ((double)level.time / 20.0) * 360.0 * 11930464.711111112 +
                           6755399441055744.0);
    dVar2 = dVar8 * dVar2 *
            *(double *)(&DAT_0060b290 + (ulong)(1 < (player->mo->super_AActor).waterlevel) * 8);
  }
  if (player->playerstate == '\0') {
    dVar8 = player->viewheight + player->deltaviewheight;
    player->viewheight = dVar8;
    if (dVar8 <= dVar7) {
      if ((dVar8 < dVar7 * 0.5) &&
         (player->viewheight = dVar7 * 0.5, player->deltaviewheight <= 0.0)) {
        dVar7 = 1.52587890625e-05;
        goto LAB_0046a865;
      }
    }
    else {
      player->viewheight = dVar7;
      dVar7 = 0.0;
LAB_0046a865:
      player->deltaviewheight = dVar7;
    }
    dVar7 = player->deltaviewheight;
    if ((dVar7 != 0.0) || (NAN(dVar7))) {
      dVar7 = dVar7 + 0.25;
      player->deltaviewheight = dVar7;
      if ((dVar7 == 0.0) && (!NAN(dVar7))) {
        player->deltaviewheight = 1.52587890625e-05;
      }
    }
  }
  if (player->morphTics != 0) {
    dVar2 = 0.0;
  }
  pAVar3 = player->mo;
  dVar7 = (pAVar3->super_AActor).__Pos.Z;
  dVar2 = dVar2 * pAVar3->ViewBob + player->viewheight + dVar7;
  player->viewz = dVar2;
  if (player->playerstate != '\x01') {
    dVar8 = (pAVar3->super_AActor).Floorclip;
    if (((dVar8 != 0.0) || (NAN(dVar8))) && (dVar7 <= (pAVar3->super_AActor).floorz)) {
      player->viewz = dVar2 - dVar8;
    }
  }
  dVar7 = (pAVar3->super_AActor).ceilingz + -4.0;
  if (dVar7 < player->viewz) {
    player->viewz = dVar7;
  }
  dVar2 = (pAVar3->super_AActor).floorz + 4.0;
  if (dVar2 < player->viewz || dVar2 == player->viewz) {
    return;
  }
LAB_0046a838:
  player->viewz = dVar2;
  return;
}

Assistant:

void P_CalcHeight (player_t *player) 
{
	DAngle		angle;
	double	 	bob;
	bool		still = false;

	// Regular movement bobbing
	// (needs to be calculated for gun swing even if not on ground)

	// killough 10/98: Make bobbing depend only on player-applied motion.
	//
	// Note: don't reduce bobbing here if on ice: if you reduce bobbing here,
	// it causes bobbing jerkiness when the player moves from ice to non-ice,
	// and vice-versa.

	if (player->cheats & CF_NOCLIP2)
	{
		player->bob = 0;
	}
	else if ((player->mo->flags & MF_NOGRAVITY) && !player->onground)
	{
		player->bob = 0.5;
	}
	else
	{
		player->bob = player->Vel.LengthSquared();
		if (player->bob == 0)
		{
			still = true;
		}
		else
		{
			player->bob *= player->userinfo.GetMoveBob();

			if (player->bob > MAXBOB)
				player->bob = MAXBOB;
		}
	}

	double defaultviewheight = player->mo->ViewHeight + player->crouchviewdelta;

	if (player->cheats & CF_NOVELOCITY)
	{
		player->viewz = player->mo->Z() + defaultviewheight;

		if (player->viewz > player->mo->ceilingz-4)
			player->viewz = player->mo->ceilingz-4;

		return;
	}

	if (still)
	{
		if (player->health > 0)
		{
			angle = level.time / (120 * TICRATE / 35.) * 360.;
			bob = player->userinfo.GetStillBob() * angle.Sin();
		}
		else
		{
			bob = 0;
		}
	}
	else
	{
		angle = level.time / (20 * TICRATE / 35.) * 360.;
		bob = player->bob * angle.Sin() * (player->mo->waterlevel > 1 ? 0.25f : 0.5f);
	}

	// move viewheight
	if (player->playerstate == PST_LIVE)
	{
		player->viewheight += player->deltaviewheight;

		if (player->viewheight > defaultviewheight)
		{
			player->viewheight = defaultviewheight;
			player->deltaviewheight = 0;
		}
		else if (player->viewheight < (defaultviewheight/2))
		{
			player->viewheight = defaultviewheight/2;
			if (player->deltaviewheight <= 0)
				player->deltaviewheight = 1 / 65536.;
		}
		
		if (player->deltaviewheight)	
		{
			player->deltaviewheight += 0.25;
			if (!player->deltaviewheight)
				player->deltaviewheight = 1/65536.;
		}
	}

	if (player->morphTics)
	{
		bob = 0;
	}
	player->viewz = player->mo->Z() + player->viewheight + (bob * player->mo->ViewBob); // [SP] Allow DECORATE changes to view bobbing speed.
	if (player->mo->Floorclip && player->playerstate != PST_DEAD
		&& player->mo->Z() <= player->mo->floorz)
	{
		player->viewz -= player->mo->Floorclip;
	}
	if (player->viewz > player->mo->ceilingz - 4)
	{
		player->viewz = player->mo->ceilingz - 4;
	}
	if (player->viewz < player->mo->floorz + 4)
	{
		player->viewz = player->mo->floorz + 4;
	}
}